

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O2

void start_pass(j_compress_ptr cinfo,boolean gather_statistics)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_component_info *pjVar4;
  code *pcVar5;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var6;
  _func_void_j_compress_ptr *__s;
  long lVar7;
  ulong uVar8;
  
  pjVar2 = cinfo->entropy;
  if (gather_statistics != 0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x31;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->progressive_mode == 0) {
    pcVar5 = encode_mcu;
  }
  else if (cinfo->Ah == 0) {
    if (cinfo->Ss == 0) {
      pcVar5 = encode_mcu_DC_first;
    }
    else {
      pcVar5 = encode_mcu_AC_first;
    }
  }
  else if (cinfo->Ss == 0) {
    pcVar5 = encode_mcu_DC_refine;
  }
  else {
    pcVar5 = encode_mcu_AC_refine;
  }
  pjVar2->encode_mcu = pcVar5;
  for (lVar7 = 0; lVar7 < cinfo->comps_in_scan; lVar7 = lVar7 + 1) {
    pjVar4 = cinfo->cur_comp_info[lVar7];
    if ((cinfo->Ss == 0) && (cinfo->Ah == 0)) {
      iVar1 = pjVar4->dc_tbl_no;
      uVar8 = (ulong)iVar1;
      if (0xf < uVar8) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x32;
        (pjVar3->msg_parm).i[0] = iVar1;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      p_Var6 = (&pjVar2[4].encode_mcu)[uVar8];
      if (p_Var6 == (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)0x0) {
        p_Var6 = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)
                 (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x40);
        (&pjVar2[4].encode_mcu)[uVar8] = p_Var6;
      }
      *(undefined8 *)(p_Var6 + 0x30) = 0;
      *(undefined8 *)(p_Var6 + 0x38) = 0;
      *(undefined8 *)(p_Var6 + 0x20) = 0;
      *(undefined8 *)(p_Var6 + 0x28) = 0;
      *(undefined8 *)(p_Var6 + 0x10) = 0;
      *(undefined8 *)(p_Var6 + 0x18) = 0;
      *(undefined8 *)p_Var6 = 0;
      *(undefined8 *)(p_Var6 + 8) = 0;
      *(undefined4 *)((long)&pjVar2[2].finish_pass + lVar7 * 4) = 0;
      *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar7 * 4) = 0;
    }
    if (cinfo->Se != 0) {
      iVar1 = pjVar4->ac_tbl_no;
      uVar8 = (ulong)iVar1;
      if (0xf < uVar8) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x32;
        (pjVar3->msg_parm).i[0] = iVar1;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      __s = (&pjVar2[9].finish_pass)[uVar8];
      if (__s == (_func_void_j_compress_ptr *)0x0) {
        __s = (_func_void_j_compress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
        (&pjVar2[9].finish_pass)[uVar8] = __s;
      }
      memset(__s,0,0x100);
    }
  }
  pjVar2[1].start_pass = (_func_void_j_compress_ptr_boolean *)0x0;
  pjVar2[1].encode_mcu = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)0x10000;
  pjVar2[1].finish_pass = (_func_void_j_compress_ptr *)0x0;
  pjVar2[2].start_pass = (_func_void_j_compress_ptr_boolean *)0x0;
  pjVar2[2].encode_mcu = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)0xffffffff0000000b;
  *(uint *)&pjVar2[4].start_pass = cinfo->restart_interval;
  *(undefined4 *)((long)&pjVar2[4].start_pass + 4) = 0;
  return;
}

Assistant:

METHODDEF(void)
start_pass (j_compress_ptr cinfo, boolean gather_statistics)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci, tbl;
  jpeg_component_info * compptr;

  if (gather_statistics)
    /* Make sure to avoid that in the master control logic!
     * We are fully adaptive here and need no extra
     * statistics gathering pass!
     */
    ERREXIT(cinfo, JERR_NOT_COMPILED);

  /* We assume jcmaster.c already validated the progressive scan parameters. */

  /* Select execution routines */
  if (cinfo->progressive_mode) {
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_first;
      else
	entropy->pub.encode_mcu = encode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_refine;
      else
	entropy->pub.encode_mcu = encode_mcu_AC_refine;
    }
  } else
    entropy->pub.encode_mcu = encode_mcu;

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->Ss == 0 && cinfo->Ah == 0) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
	entropy->dc_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->Se) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
	entropy->ac_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
#ifdef CALCULATE_SPECTRAL_CONDITIONING
      if (cinfo->progressive_mode)
	/* Section G.1.3.2: Set appropriate arithmetic conditioning value Kx */
	cinfo->arith_ac_K[tbl] = cinfo->Ss + ((8 + cinfo->Se - cinfo->Ss) >> 4);
#endif
    }
  }

  /* Initialize arithmetic encoding variables */
  entropy->c = 0;
  entropy->a = 0x10000L;
  entropy->sc = 0;
  entropy->zc = 0;
  entropy->ct = 11;
  entropy->buffer = -1;  /* empty */

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}